

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixedContentModel.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::MixedContentModel::hasDups(MixedContentModel *this)

{
  XMLCh XVar1;
  QName *this_00;
  XMLCh *pXVar2;
  XMLCh *pXVar3;
  XMLCh XVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  
  if (this->fCount == 1) {
    bVar7 = false;
  }
  else {
    bVar7 = this->fCount != 0;
    if (bVar7) {
      uVar6 = 0;
      do {
        bVar8 = this->fCount != 0;
        if (bVar8) {
          this_00 = this->fChildren[uVar6];
          uVar5 = 0;
          do {
            if (uVar5 != uVar6) {
              if (this->fDTD == true) {
                pXVar2 = QName::getRawName(this_00);
                pXVar3 = QName::getRawName(this->fChildren[uVar5]);
                if (pXVar2 != pXVar3) {
                  if ((pXVar2 != (XMLCh *)0x0) && (pXVar3 != (XMLCh *)0x0)) {
                    do {
                      XVar4 = *pXVar2;
                      if (XVar4 == L'\0') goto LAB_002f5656;
                      pXVar2 = pXVar2 + 1;
                      XVar1 = *pXVar3;
                      pXVar3 = pXVar3 + 1;
                    } while (XVar4 == XVar1);
                    goto LAB_002f5661;
                  }
                  if (pXVar2 != (XMLCh *)0x0) {
                    XVar4 = *pXVar2;
                    goto LAB_002f563f;
                  }
LAB_002f5651:
                  if (pXVar3 != (XMLCh *)0x0) goto LAB_002f5656;
                }
LAB_002f5674:
                if (bVar8) {
                  return bVar7;
                }
                break;
              }
              if (this_00->fURIId == this->fChildren[uVar5]->fURIId) {
                pXVar2 = this_00->fLocalPart;
                pXVar3 = this->fChildren[uVar5]->fLocalPart;
                if (pXVar2 == pXVar3) goto LAB_002f5674;
                if ((pXVar2 == (XMLCh *)0x0) || (pXVar3 == (XMLCh *)0x0)) {
                  if (pXVar2 == (XMLCh *)0x0) goto LAB_002f5651;
                  XVar4 = *pXVar2;
LAB_002f563f:
                  bVar9 = XVar4 == L'\0';
                  if ((pXVar3 != (XMLCh *)0x0) && (XVar4 == L'\0')) {
LAB_002f5656:
                    bVar9 = *pXVar3 == L'\0';
                  }
                  if (bVar9) goto LAB_002f5674;
                }
                else {
                  do {
                    XVar4 = *pXVar2;
                    if (XVar4 == L'\0') goto LAB_002f5656;
                    pXVar2 = pXVar2 + 1;
                    XVar1 = *pXVar3;
                    pXVar3 = pXVar3 + 1;
                  } while (XVar4 == XVar1);
                }
              }
            }
LAB_002f5661:
            uVar5 = uVar5 + 1;
            bVar8 = uVar5 < this->fCount;
          } while (bVar8);
        }
        uVar6 = uVar6 + 1;
        bVar7 = uVar6 < this->fCount;
      } while (bVar7);
    }
  }
  return bVar7;
}

Assistant:

bool MixedContentModel::hasDups() const
{
    // Can't have dups if only one child
    if (fCount == 1)
        return false;

    for (XMLSize_t index = 0; index < fCount; index++)
    {
        const QName* curVal = fChildren[index];
        for (XMLSize_t iIndex = 0; iIndex < fCount; iIndex++)
        {
            if (iIndex == index)
                continue;

            if (fDTD) {
                if (XMLString::equals(curVal->getRawName(), fChildren[iIndex]->getRawName())) {
                    return true;
                }
            }
            else {
                if ((curVal->getURI() == fChildren[iIndex]->getURI()) &&
                    (XMLString::equals(curVal->getLocalPart(), fChildren[iIndex]->getLocalPart()))) {
                    return true;
                }
            }
        }
    }
    return false;
}